

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  URLPattern *pUVar1;
  anon_union_40_3_e2f18bb4_for_content *paVar2;
  byte bVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  FILE *pFVar12;
  unsigned_long *puVar13;
  unsigned_long uVar14;
  int iVar15;
  size_t sVar16;
  char *pcVar17;
  URLGlob *glob_00;
  char **ppcVar18;
  char *__dest;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  byte *pbVar22;
  ulong uVar23;
  size_t colons;
  byte *pbVar24;
  ulong uVar25;
  byte *pbVar26;
  uint uVar27;
  size_t sVar28;
  anon_union_40_3_e2f18bb4_for_content *paVar29;
  byte *pbVar30;
  byte *pbVar31;
  CURLcode local_294;
  byte *local_288;
  char end_c;
  char max_c;
  char min_c;
  unsigned_long local_278;
  int local_26c;
  byte *local_268;
  ulong local_260;
  char *local_258;
  FILE *local_250;
  unsigned_long *local_248;
  URLGlob **local_240;
  char *endp;
  
  *glob = (URLGlob *)0x0;
  local_240 = glob;
  sVar16 = strlen(url);
  pcVar17 = (char *)malloc(sVar16 + 1);
  if (pcVar17 != (char *)0x0) {
    *pcVar17 = '\0';
    local_278 = 1;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar16;
      glob_00->glob_buffer = pcVar17;
      local_288 = (byte *)0x1;
      local_294 = CURLE_OK;
      local_26c = 0;
      local_258 = url;
      local_250 = error;
      local_248 = urlnum;
LAB_0011bf1b:
      if ((*url != 0) && (local_294 == CURLE_OK)) {
        local_268 = (byte *)glob_00->glob_buffer;
        uVar25 = 0;
LAB_0011bf45:
        for (; bVar3 = *url, bVar3 == 0x5b; url = (char *)((byte *)url + sVar16)) {
          sVar28 = 2;
          sVar16 = 0;
          uVar20 = 0;
          local_260 = uVar25;
          do {
            bVar3 = ((byte *)url)[sVar28 - 1];
            iVar15 = Curl_isalnum((uint)bVar3);
            uVar23 = local_260;
            pbVar22 = local_268;
            bVar11 = true;
            if (iVar15 == 0) {
              if (bVar3 < 0x3a) {
                if ((bVar3 != 0x25) && (bVar3 != 0x2e)) {
LAB_0011bfa5:
                  bVar11 = false;
                  uVar25 = 0;
                }
              }
              else if (bVar3 == 0x5d) {
                uVar25 = (ulong)(1 < uVar20);
                bVar11 = false;
                sVar16 = sVar28;
              }
              else {
                if (bVar3 != 0x3a) goto LAB_0011bfa5;
                uVar20 = uVar20 + 1;
              }
            }
            sVar28 = sVar28 + 1;
          } while (bVar11);
          if (((uVar25 & 1) == 0) && (((byte *)url)[1] == 0x5d)) {
            sVar16 = 2;
          }
          uVar25 = local_260;
          if (sVar16 == 0) goto LAB_0011c080;
          memcpy(local_268,url,sVar16);
          local_268 = pbVar22 + sVar16;
          uVar25 = uVar23 + sVar16;
        }
        if (bVar3 < 0x5d) {
          if (bVar3 == 0) goto LAB_0011c080;
          if (((bVar3 == 0x5c) && (((byte *)url)[1] - 0x5b < 0x23)) &&
             ((0x500000005U >> ((ulong)(((byte *)url)[1] - 0x5b) & 0x3f) & 1) != 0)) {
            url = (char *)((byte *)url + 1);
            local_288 = local_288 + 1;
          }
LAB_0011c05a:
          bVar3 = *url;
          url = (char *)((byte *)url + 1);
          *local_268 = bVar3;
          local_268 = local_268 + 1;
          local_288 = local_288 + 1;
          uVar25 = uVar25 + 1;
          goto LAB_0011bf45;
        }
        if (bVar3 == 0x5d) {
LAB_0011c11a:
          pcVar17 = "unmatched close brace/bracket";
          goto LAB_0011c786;
        }
        if (bVar3 != 0x7b) {
          if (bVar3 != 0x7d) goto LAB_0011c05a;
          goto LAB_0011c11a;
        }
LAB_0011c080:
        if (uVar25 == 0) {
          if (*url != 0x5b) {
            if (*url == 0x7b) {
              pbVar24 = (byte *)url + 1;
              sVar4 = glob_00->size;
              pbVar22 = (byte *)glob_00->glob_buffer;
              glob_00->pattern[sVar4].type = UPTSet;
              paVar29 = &glob_00->pattern[sVar4].content;
              paVar2 = &glob_00->pattern[sVar4].content;
              (paVar2->Set).elements = (char **)0x0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->min_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->max_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->ptr_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->field_0x3 = 0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->step = 0;
              glob_00->pattern[sVar4].globindex = local_26c;
              local_26c = local_26c + 1;
              pbVar31 = local_288;
              pbVar30 = pbVar24;
LAB_0011c19f:
              pbVar26 = pbVar31 + 1;
              bVar3 = *pbVar30;
              if (bVar3 < 0x5c) {
                uVar14 = local_278;
                if (bVar3 != 0x2c) {
                  if (bVar3 != 0) {
                    if (bVar3 != 0x5b) goto LAB_0011c2f1;
LAB_0011c554:
                    pcVar17 = "nested brace";
                    goto LAB_0011c65c;
                  }
                  glob_00->error = "unmatched brace";
                  glob_00->pos = (size_t)local_288;
                  goto LAB_0011c75b;
                }
LAB_0011c227:
                local_278 = uVar14;
                *pbVar22 = 0;
                if ((paVar29->Set).elements == (char **)0x0) {
                  ppcVar18 = (char **)malloc(8);
                  (paVar29->Set).elements = ppcVar18;
                }
                else {
                  ppcVar18 = (char **)realloc((paVar29->Set).elements,
                                              (long)glob_00->pattern[sVar4].content.Set.size * 8 + 8
                                             );
                  if (ppcVar18 == (char **)0x0) {
                    glob_00->error = "out of memory";
                    glob_00->pos = 0;
                    local_294 = CURLE_OUT_OF_MEMORY;
                    url = (char *)pbVar24;
                    local_288 = pbVar26;
                    goto LAB_0011c763;
                  }
                  (paVar29->Set).elements = ppcVar18;
                }
                ppcVar18 = (paVar29->Set).elements;
                if (ppcVar18 == (char **)0x0) {
LAB_0011c529:
                  glob_00->error = "out of memory";
                  glob_00->pos = 0;
                  local_294 = CURLE_OUT_OF_MEMORY;
                  url = (char *)pbVar24;
                  local_288 = pbVar26;
                  goto LAB_0011c763;
                }
                pcVar17 = strdup(glob_00->glob_buffer);
                ppcVar18[glob_00->pattern[sVar4].content.Set.size] = pcVar17;
                iVar15 = glob_00->pattern[sVar4].content.Set.size;
                if (glob_00->pattern[sVar4].content.Set.elements[iVar15] == (char *)0x0)
                goto LAB_0011c529;
                glob_00->pattern[sVar4].content.Set.size = iVar15 + 1;
                if (*pbVar30 == 0x7d) {
                  pbVar30 = pbVar30 + 1;
                  uVar14 = local_278;
                  goto LAB_0011c570;
                }
                pbVar22 = (byte *)glob_00->glob_buffer;
                pbVar31 = pbVar26;
              }
              else {
                if (bVar3 < 0x7b) {
                  if (bVar3 == 0x5c) {
                    if (pbVar30[1] != 0) {
                      pbVar26 = pbVar31 + 2;
                      pbVar30 = pbVar30 + 1;
                    }
                  }
                  else if (bVar3 == 0x5d) goto LAB_0011c642;
                }
                else {
                  if (bVar3 == 0x7d) {
                    if (pbVar24 == pbVar30) {
                      pcVar17 = "empty string within braces";
                      goto LAB_0011c65c;
                    }
                    iVar15 = glob_00->pattern[sVar4].content.Set.size + 1;
                    if (iVar15 != 0) {
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = (long)iVar15;
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = local_278;
                      uVar14 = SUB168(auVar5 * auVar8,0);
                      if (SUB168(auVar5 * auVar8,8) == 0) goto LAB_0011c227;
                      glob_00->error = "range overflow";
                      glob_00->pos = 0;
                      goto LAB_0011c75b;
                    }
                    local_278 = 0;
                    uVar14 = local_278;
                    goto LAB_0011c227;
                  }
                  if (bVar3 == 0x7b) goto LAB_0011c554;
                }
LAB_0011c2f1:
                *pbVar22 = *pbVar30;
                pbVar22 = pbVar22 + 1;
                pbVar31 = pbVar26;
              }
              pbVar30 = pbVar30 + 1;
              goto LAB_0011c19f;
            }
            goto LAB_0011c763;
          }
          pbVar22 = (byte *)url + 1;
          pbVar26 = local_288 + 1;
          pUVar1 = glob_00->pattern + glob_00->size;
          glob_00->pattern[glob_00->size].globindex = local_26c;
          local_26c = local_26c + 1;
          iVar15 = Curl_isalpha((uint)((byte *)url)[1]);
          if (iVar15 == 0) {
            iVar15 = Curl_isdigit((uint)*pbVar22);
            if (iVar15 == 0) {
              glob_00->error = "bad range specification";
            }
            else {
              pUVar1->type = UPTNumRange;
              (pUVar1->content).NumRange.padlength = 0;
              if ((*pbVar22 == 0x30) && (iVar15 = Curl_isdigit(0x30), iVar15 != 0)) {
                pbVar31 = (byte *)url + 2;
                do {
                  piVar19 = &(pUVar1->content).NumRange.padlength;
                  *piVar19 = *piVar19 + 1;
                  iVar15 = Curl_isdigit((uint)*pbVar31);
                  pbVar31 = pbVar31 + 1;
                } while (iVar15 != 0);
              }
              piVar19 = __errno_location();
              *piVar19 = 0;
              uVar25 = strtoul((char *)pbVar22,&endp,10);
              pbVar31 = pbVar22;
              if (((*piVar19 == 0) && ((byte *)endp != pbVar22)) &&
                 (pbVar30 = (byte *)endp, *endp == '-')) {
                do {
                  do {
                    pbVar30 = pbVar30 + 1;
                    bVar3 = *pbVar30;
                  } while (bVar3 == 0x20);
                } while (bVar3 == 9);
                iVar15 = Curl_isdigit((uint)bVar3);
                pbVar31 = pbVar30;
                if (iVar15 == 0) goto LAB_0011c4cb;
                *piVar19 = 0;
                uVar20 = strtoul((char *)pbVar30,&endp,10);
                if (*piVar19 == 0) {
                  uVar23 = 1;
                  if (*endp == ':') {
                    pbVar30 = (byte *)(endp + 1);
                    *piVar19 = 0;
                    uVar23 = strtoul((char *)pbVar30,&endp,10);
                    if (*piVar19 != 0) {
                      endp = (char *)0x0;
                    }
                  }
                }
                else {
                  endp = (char *)0x0;
                  uVar23 = 0;
                }
                if ((endp == (char *)0x0) || (*endp != ']')) {
                  endp = (char *)0x0;
                }
                else {
                  pbVar30 = (byte *)(endp + 1);
                }
              }
              else {
LAB_0011c4cb:
                pbVar30 = pbVar31;
                endp = (char *)0x0;
                uVar20 = 0;
                uVar23 = 0;
              }
              pbVar26 = pbVar30 + ((long)pbVar26 - (long)pbVar22);
              pcVar17 = "bad range";
              if (((endp != (char *)0x0) && (pcVar17 = "bad range", uVar23 != 0)) &&
                 ((uVar20 != uVar25 || (pcVar17 = "bad range", uVar23 == 1)))) {
                uVar21 = uVar20 - uVar25;
                if ((uVar21 == 0) ||
                   ((pcVar17 = "bad range", uVar25 <= uVar20 &&
                    (pcVar17 = "bad range", uVar23 <= uVar21)))) {
                  (pUVar1->content).NumRange.min_n = uVar25;
                  (pUVar1->content).NumRange.ptr_n = uVar25;
                  (pUVar1->content).NumRange.max_n = uVar20;
                  (pUVar1->content).NumRange.step = uVar23;
                  uVar25 = uVar21 / uVar23 + 1;
                  uVar14 = 0;
                  if (uVar25 != 0) {
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = uVar25;
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = local_278;
                    pcVar17 = "range overflow";
                    uVar14 = SUB168(auVar6 * auVar9,0);
                    if (SUB168(auVar6 * auVar9,8) != 0) goto LAB_0011c510;
                  }
LAB_0011c570:
                  local_278 = uVar14;
                  local_294 = CURLE_OK;
                  url = (char *)pbVar30;
                  local_288 = pbVar26;
                  goto LAB_0011c763;
                }
              }
LAB_0011c510:
              glob_00->error = pcVar17;
            }
          }
          else {
            pUVar1->type = UPTCharRange;
            iVar15 = __isoc99_sscanf(pbVar22,"%c-%c%c",&min_c,&max_c,&end_c);
            uVar25 = 1;
            bVar11 = true;
            pbVar31 = pbVar22;
            if (iVar15 == 3) {
              if (end_c == ']') {
                bVar11 = false;
                pbVar31 = (byte *)url + 5;
              }
              else if (end_c == ':') {
                piVar19 = __errno_location();
                *piVar19 = 0;
                uVar25 = strtoul((char *)((byte *)url + 5),&endp,10);
                if ((*piVar19 == 0) && ((byte *)url + 5 != (byte *)endp)) {
                  pbVar31 = (byte *)(endp + 1);
                  if (*endp != ']') {
                    uVar25 = 0;
                    pbVar31 = pbVar22;
                  }
                }
                else {
                  uVar25 = 0;
                }
                bVar11 = false;
              }
            }
            pbVar26 = pbVar31 + ((long)pbVar26 - (long)pbVar22);
            pcVar17 = "bad range";
            if (((!bVar11) && (pcVar17 = "bad range", 0xffffffff80000000 < uVar25 - 0x80000000)) &&
               ((min_c != max_c || (pcVar17 = "bad range", uVar25 == 1)))) {
              if (min_c == max_c) {
LAB_0011c7bc:
                (pUVar1->content).CharRange.step = (int)uVar25;
                (pUVar1->content).CharRange.min_c = min_c;
                (pUVar1->content).CharRange.ptr_c = min_c;
                (pUVar1->content).CharRange.max_c = max_c;
                iVar15 = ((int)max_c - (int)min_c) / (int)uVar25 + 1;
                if (iVar15 == 0) {
                  local_278 = 0;
                  uVar14 = local_278;
                }
                else {
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = (long)iVar15;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = local_278;
                  pcVar17 = "range overflow";
                  uVar14 = SUB168(auVar7 * auVar10,0);
                  if (SUB168(auVar7 * auVar10,8) != 0) goto LAB_0011c74d;
                }
                local_278 = uVar14;
                local_294 = CURLE_OK;
                url = (char *)pbVar31;
                local_288 = pbVar26;
                goto LAB_0011c763;
              }
              pcVar17 = "bad range";
              if (min_c <= max_c) {
                uVar27 = (int)max_c - (int)min_c;
                pcVar17 = "bad range";
                if (((int)uVar27 < 0x1a) && (pcVar17 = "bad range", uVar25 <= uVar27))
                goto LAB_0011c7bc;
              }
            }
LAB_0011c74d:
            glob_00->error = pcVar17;
          }
          goto LAB_0011c754;
        }
        *local_268 = 0;
        sVar4 = glob_00->size;
        pcVar17 = glob_00->glob_buffer;
        glob_00->pattern[sVar4].type = UPTSet;
        glob_00->pattern[sVar4].globindex = -1;
        glob_00->pattern[sVar4].content.NumRange.max_n = 1;
        ppcVar18 = (char **)malloc(8);
        glob_00->pattern[sVar4].content.Set.elements = ppcVar18;
        if (ppcVar18 == (char **)0x0) {
          glob_00->error = "out of memory";
          glob_00->pos = 0;
          local_294 = CURLE_OUT_OF_MEMORY;
        }
        else {
          __dest = (char *)malloc(uVar25 + 1);
          *ppcVar18 = __dest;
          if (__dest == (char *)0x0) {
            glob_00->error = "out of memory";
            glob_00->pos = 0;
            local_294 = CURLE_OUT_OF_MEMORY;
          }
          else {
            memcpy(__dest,pcVar17,uVar25);
            __dest[uVar25] = '\0';
            local_294 = CURLE_OK;
          }
        }
        goto LAB_0011c763;
      }
      goto LAB_0011c8f0;
    }
    free(pcVar17);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011c642:
  pcVar17 = "unexpected close bracket";
LAB_0011c65c:
  glob_00->error = pcVar17;
LAB_0011c754:
  glob_00->pos = (size_t)pbVar26;
LAB_0011c75b:
  local_294 = CURLE_URL_MALFORMAT;
  url = (char *)((byte *)url + 1);
  local_288 = pbVar26;
LAB_0011c763:
  uVar25 = glob_00->size + 1;
  glob_00->size = uVar25;
  bVar11 = true;
  pcVar17 = "too many globs";
  if (99 < uVar25) {
LAB_0011c786:
    glob_00->error = pcVar17;
    glob_00->pos = (size_t)local_288;
    bVar11 = false;
  }
  if (!bVar11) {
    local_294 = CURLE_URL_MALFORMAT;
LAB_0011c8f0:
    puVar13 = local_248;
    pFVar12 = local_250;
    if (local_294 != CURLE_OK) {
      if ((local_250 != (FILE *)0x0) &&
         (ppcVar18 = (char **)glob_00->error, ppcVar18 != (char **)0x0)) {
        sVar4 = glob_00->pos;
        if (sVar4 != 0) {
          curl_msnprintf(&endp,0x200,"%s in URL position %zu:\n%s\n%*s^",ppcVar18,sVar4,local_258,
                         sVar4 - 1," ");
          ppcVar18 = &endp;
        }
        curl_mfprintf(pFVar12,"curl: (%d) %s\n",local_294,ppcVar18);
      }
      glob_cleanup(glob_00);
      *puVar13 = 1;
      return local_294;
    }
    *local_248 = local_278;
    *local_240 = glob_00;
    return CURLE_OK;
  }
  goto LAB_0011bf1b;
}

Assistant:

CURLcode glob_url(URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}